

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_AddClause(sat_solver *pSat,int *pBeg,int *pEnd)

{
  uint *pEnd_00;
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  
  if (pEnd <= pBeg) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x6ca,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  puVar3 = (uint *)pBeg;
  if (pSat->fPrintClause != 0) {
    do {
      pcVar9 = "!";
      if ((*puVar3 & 1) == 0) {
        pcVar9 = "";
      }
      printf("%s%d ",pcVar9,(ulong)(uint)((int)*puVar3 >> 1));
      puVar3 = puVar3 + 1;
    } while (puVar3 < pEnd);
    putchar(10);
  }
  if ((pSat->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (pSat->temp_clause).size = 0;
  puVar3 = (uint *)(pSat->temp_clause).ptr;
  do {
    uVar7 = *pBeg;
    uVar8 = (pSat->temp_clause).size;
    if (uVar8 == (pSat->temp_clause).cap) {
      iVar2 = (uVar8 >> 1) * 3;
      if ((int)uVar8 < 4) {
        iVar2 = uVar8 * 2;
      }
      if (puVar3 == (uint *)0x0) {
        puVar3 = (uint *)malloc((long)iVar2 << 2);
      }
      else {
        puVar3 = (uint *)realloc(puVar3,(long)iVar2 << 2);
      }
      (pSat->temp_clause).ptr = (int *)puVar3;
      if (puVar3 == (uint *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(pSat->temp_clause).cap * 9.5367431640625e-07,
               (double)iVar2 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (pSat->temp_clause).cap = iVar2;
      uVar8 = (pSat->temp_clause).size;
    }
    (pSat->temp_clause).size = uVar8 + 1;
    puVar3[(int)uVar8] = uVar7;
    pBeg = (int *)((uint *)pBeg + 1);
  } while (pBeg < pEnd);
  iVar2 = (pSat->temp_clause).size;
  iVar6 = (int)*puVar3 >> 1;
  pEnd_00 = puVar3 + iVar2;
  if (1 < (long)iVar2) {
    puVar4 = puVar3 + 1;
    do {
      uVar7 = *puVar4;
      puVar5 = puVar4;
      iVar1 = (int)uVar7 >> 1;
      if ((int)uVar7 >> 1 <= iVar6) {
        iVar1 = iVar6;
      }
      for (; (iVar6 = iVar1, puVar3 < puVar5 && ((int)uVar7 < (int)puVar5[-1]));
          puVar5 = puVar5 + -1) {
        *puVar5 = puVar5[-1];
        iVar1 = iVar6;
      }
      *puVar5 = uVar7;
      puVar4 = puVar4 + 1;
    } while (puVar4 < pEnd_00);
  }
  sat_solver_setnvars(pSat,iVar6 + 1);
  if (((Sto_Man_t *)pSat->pStore != (Sto_Man_t *)0x0) &&
     (iVar6 = Sto_ManAddClause((Sto_Man_t *)pSat->pStore,(lit *)puVar3,(lit *)pEnd_00), iVar6 == 0))
  {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x6e8,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  iVar6 = 0;
  if (0 < iVar2) {
    uVar7 = 0xfffffffe;
    puVar4 = puVar3;
    puVar5 = puVar3;
    do {
      uVar8 = *puVar4;
      if (((uVar8 ^ uVar7) == 1) || ((uVar8 & 1) == (int)pSat->assigns[(int)uVar8 >> 1]))
      goto LAB_00550844;
      if (pSat->assigns[(int)uVar8 >> 1] == '\x03' && uVar8 != uVar7) {
        *puVar5 = uVar8;
        puVar5 = puVar5 + 1;
        uVar7 = uVar8;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 < pEnd_00);
    if (puVar5 != puVar3) {
      if ((long)puVar5 - (long)puVar3 == 4) {
        uVar7 = *puVar3;
        iVar2 = (int)uVar7 >> 1;
        if (pSat->pFreqs[iVar2] == '\0') {
          pSat->pFreqs[iVar2] = '\x01';
        }
        uVar8 = (uint)pSat->assigns[iVar2];
        if (uVar8 != 3) {
          return (uint)((uVar7 & 1) == uVar8);
        }
        pSat->assigns[iVar2] = (byte)uVar7 & 1;
        pSat->levels[iVar2] = (pSat->trail_lim).size;
        pSat->reasons[iVar2] = 0;
        iVar2 = pSat->qtail;
        pSat->qtail = iVar2 + 1;
        pSat->trail[iVar2] = uVar7;
      }
      else {
        sat_solver_clause_new(pSat,(lit *)puVar3,(lit *)puVar5,0);
      }
LAB_00550844:
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int Ifn_AddClause( sat_solver * pSat, int * pBeg, int * pEnd )
{
    int fVerbose = 0;
    int RetValue = sat_solver_addclause( pSat, pBeg, pEnd );
    if ( fVerbose )
    {
        for ( ; pBeg < pEnd; pBeg++ )
            printf( "%c%d ", Abc_LitIsCompl(*pBeg) ? '-':'+', Abc_Lit2Var(*pBeg) );
        printf( "\n" );
    }
    return RetValue;
}